

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.h
# Opt level: O0

void __thiscall embree::Statistics::add(Statistics *this,float a)

{
  float local_30;
  float local_2c;
  float a_local;
  Statistics *this_local;
  
  this->v = (double)a + this->v;
  this->v2 = (double)(a * a) + this->v2;
  local_2c = a;
  if (this->vmin < a) {
    local_2c = this->vmin;
  }
  this->vmin = local_2c;
  local_30 = this->vmax;
  if (local_30 < a) {
    local_30 = a;
  }
  this->vmax = local_30;
  this->N = this->N + 1;
  return;
}

Assistant:

void add(float a) 
    {
      v += a;
      v2 += a*a;
      vmin = min(vmin,a);
      vmax = max(vmax,a);
      N++;
    }